

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_copy_s_w_mipsel(CPUMIPSState_conflict4 *env,uint32_t rd,uint32_t ws,uint32_t n)

{
  (env->active_tc).gpr[rd] =
       *(target_ulong_conflict *)
        ((long)(env->active_fpu).fpr + (ulong)(n & 3) * 4 + (ulong)ws * 0x10);
  return;
}

Assistant:

void helper_msa_copy_s_w(CPUMIPSState *env, uint32_t rd,
                         uint32_t ws, uint32_t n)
{
    n %= 4;
#if defined(HOST_WORDS_BIGENDIAN)
    if (n < 2) {
        n = 2 - n - 1;
    } else {
        n = 6 - n - 1;
    }
#endif
    env->active_tc.gpr[rd] = (int32_t)env->active_fpu.fpr[ws].wr.w[n];
}